

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O1

double __thiscall
imrt::ApertureILS::openBeamlet
          (ApertureILS *this,int beamlet,int aperture,Station *station,double c_eval,Plan *P)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  size_t *psVar3;
  double dVar4;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_68;
  double local_50;
  _List_node_base local_48;
  size_t local_38;
  
  local_68.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node._M_size = 0;
  local_68.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_68;
  local_68.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_68;
  local_50 = c_eval;
  dVar4 = Station::getApertureIntensity(station,aperture);
  dVar4 = EvaluationFunction::get_delta_eval
                    (P->ev,station->angle,beamlet,dVar4,&P->w,&P->Zmin,&P->Zmax,999999);
  if (dVar4 <= local_50) {
    Station::openBeamlet_abi_cxx11_
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_48,
               station,beamlet,aperture);
    p_Var2 = local_68.
             super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    while (p_Var2 != (_List_node_base *)&local_68) {
      p_Var1 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var2);
      p_Var2 = p_Var1;
    }
    local_68.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
    _M_impl._M_node._M_size = 0;
    if (local_48._M_next == &local_48) {
      psVar3 = &local_68.
                super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
                _M_impl._M_node._M_size;
      local_68.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_68;
      local_68.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_68;
    }
    else {
      psVar3 = &local_38;
      (local_48._M_prev)->_M_next = (_List_node_base *)&local_68;
      (local_48._M_next)->_M_prev = (_List_node_base *)&local_68;
      local_68.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_next = local_48._M_next;
      local_68.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_prev = local_48._M_prev;
      local_68.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node._M_size = local_38;
      local_48._M_next = &local_48;
      local_48._M_prev = &local_48;
    }
    *psVar3 = 0;
    p_Var2 = local_48._M_next;
    while (p_Var2 != &local_48) {
      p_Var1 = p_Var2->_M_next;
      operator_delete(p_Var2);
      p_Var2 = p_Var1;
    }
    p_Var2 = local_68.
             super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    if (local_68.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl._M_node._M_size != 0) {
      local_50 = Plan::incremental_eval(P,station,&local_68);
      p_Var2 = local_68.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node.super__List_node_base._M_next;
    }
  }
  else {
    Station::clearHistory(station);
    p_Var2 = local_68.
             super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
  }
  while (p_Var2 != (_List_node_base *)&local_68) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2);
    p_Var2 = p_Var1;
  }
  return local_50;
}

Assistant:

double ApertureILS::openBeamlet(int beamlet, int aperture, Station& station, double c_eval, Plan& P) {
  double aux_eval=0;
  list<pair<int, double> > diff;
  
  if (P.get_delta_eval(station, beamlet, station.getApertureIntensity(aperture)) > c_eval){
    station.clearHistory();
    return(c_eval);
  }

  diff = station.openBeamlet(beamlet, aperture);
  if(diff.size() <1) return(c_eval);
  c_eval = P.incremental_eval(station, diff);

  return(c_eval);
}